

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O3

int uv_utf16_to_wtf8(uint16_t *w_source_ptr,ssize_t w_source_len,char **target_ptr,
                    size_t *target_len_ptr)

{
  byte *pbVar1;
  ushort uVar2;
  byte *pbVar3;
  byte *pbVar4;
  size_t sVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  
  if ((target_ptr == (char **)0x0) || (pbVar4 = (byte *)*target_ptr, pbVar4 == (byte *)0x0)) {
    sVar10 = uv_utf16_length_as_wtf8(w_source_ptr,w_source_len);
    if (target_len_ptr != (size_t *)0x0) {
      *target_len_ptr = sVar10;
    }
    if (target_ptr == (char **)0x0) {
      return 0;
    }
    pbVar4 = (byte *)*target_ptr;
    if (pbVar4 == (byte *)0x0) {
      pbVar4 = (byte *)uv__malloc(sVar10 + 1);
      if (pbVar4 == (byte *)0x0) {
        return -0xc;
      }
      *target_ptr = (char *)pbVar4;
    }
  }
  else {
    sVar10 = *target_len_ptr;
  }
  pbVar1 = pbVar4 + sVar10;
  pbVar3 = pbVar4;
  if (w_source_len != 0 && sVar10 != 0) {
    while( true ) {
      uVar2 = *w_source_ptr;
      uVar9 = (ulong)uVar2;
      if (((w_source_len != 1) && ((uVar2 & 0xfc00) == 0xd800)) &&
         ((w_source_ptr[1] & 0xfc00) == 0xdc00)) {
        uVar9 = (ulong)((uint)uVar2 * 0x400 + (uint)w_source_ptr[1] + 0xfca02400);
      }
      uVar8 = (uint)uVar9;
      if ((w_source_len < 0) && (uVar8 == 0)) break;
      bVar7 = (byte)uVar9;
      if (uVar8 < 0x80) {
        *pbVar3 = bVar7;
        pbVar4 = pbVar3 + 1;
      }
      else if (uVar8 < 0x800) {
        pbVar4 = pbVar3 + 1;
        *pbVar3 = (byte)(uVar9 >> 6) | 0xc0;
        if (pbVar4 == pbVar1) goto LAB_001288a2;
        pbVar3[1] = bVar7 & 0x3f | 0x80;
        pbVar4 = pbVar3 + 2;
      }
      else {
        pbVar4 = pbVar3 + 1;
        if (uVar8 < 0x10000) {
          *pbVar3 = (byte)(uVar8 >> 0xc) | 0xe0;
          if (pbVar4 == pbVar1) goto LAB_001288a2;
          pbVar4 = pbVar3 + 2;
          pbVar3[1] = (byte)(uVar9 >> 6) & 0x3f | 0x80;
          if (pbVar4 == pbVar1) goto LAB_001288a2;
          pbVar3[2] = bVar7 & 0x3f | 0x80;
          pbVar4 = pbVar3 + 3;
        }
        else {
          *pbVar3 = (byte)(uVar8 >> 0x12) | 0xf0;
          if (pbVar4 == pbVar1) goto LAB_001288a2;
          pbVar4 = pbVar3 + 2;
          pbVar3[1] = (byte)(uVar9 >> 0xc) & 0x3f | 0x80;
          if (pbVar4 == pbVar1) goto LAB_001288a2;
          pbVar4 = pbVar3 + 3;
          pbVar3[2] = (byte)(uVar9 >> 6) & 0x3f | 0x80;
          if (pbVar4 == pbVar1) goto LAB_001288a2;
          pbVar3[3] = bVar7 & 0x3f | 0x80;
          pbVar4 = pbVar3 + 4;
          w_source_ptr = w_source_ptr + 1;
          w_source_len = w_source_len - (ulong)(0 < w_source_len);
        }
      }
      sVar10 = (long)pbVar4 - (long)*target_ptr;
      w_source_ptr = w_source_ptr + 1;
      w_source_len = w_source_len - (ulong)(0 < w_source_len);
      if ((pbVar4 == pbVar1) || (pbVar3 = pbVar4, w_source_len == 0)) goto LAB_001288a2;
    }
    w_source_len = 0;
    pbVar4 = pbVar3;
  }
LAB_001288a2:
  if ((target_len_ptr != (size_t *)0x0) && (pbVar4 != pbVar1)) {
    *target_len_ptr = (long)pbVar4 - (long)*target_ptr;
  }
  if (((w_source_len < 0) && (pbVar4 == pbVar1)) && (*w_source_ptr == 0)) {
    w_source_len = 0;
  }
  iVar6 = -0x69;
  if (w_source_len == 0) {
    iVar6 = 0;
  }
  *pbVar4 = 0;
  if ((target_len_ptr != (size_t *)0x0) && (w_source_len != 0)) {
    sVar5 = uv_utf16_length_as_wtf8(w_source_ptr,w_source_len);
    *target_len_ptr = sVar5 + sVar10;
    iVar6 = -0x69;
  }
  return iVar6;
}

Assistant:

int uv_utf16_to_wtf8(const uint16_t* w_source_ptr,
                     ssize_t w_source_len,
                     char** target_ptr,
                     size_t* target_len_ptr) {
  size_t target_len;
  char* target;
  char* target_end;
  int32_t code_point;

  /* If *target_ptr is provided, then *target_len_ptr must be its length
   * (excluding space for NUL), otherwise we will compute the target_len_ptr
   * length and may return a new allocation in *target_ptr if target_ptr is
   * provided. */
  if (target_ptr == NULL || *target_ptr == NULL) {
    target_len = uv_utf16_length_as_wtf8(w_source_ptr, w_source_len);
    if (target_len_ptr != NULL)
      *target_len_ptr = target_len;
  } else {
    target_len = *target_len_ptr;
  }

  if (target_ptr == NULL)
    return 0;

  if (*target_ptr == NULL) {
    target = uv__malloc(target_len + 1);
    if (target == NULL) {
      return UV_ENOMEM;
    }
    *target_ptr = target;
  } else {
    target = *target_ptr;
  }

  target_end = target + target_len;

  while (target != target_end && w_source_len) {
    code_point = uv__get_surrogate_value(w_source_ptr, w_source_len);
    /* Can be invalid UTF-8 but must be valid WTF-8. */
    assert(code_point >= 0);
    if (w_source_len < 0 && code_point == 0) {
      w_source_len = 0;
      break;
    }
    if (code_point < 0x80) {
      *target++ = code_point;
    } else if (code_point < 0x800) {
      *target++ = 0xC0 | (code_point >> 6);
      if (target == target_end)
        break;
      *target++ = 0x80 | (code_point & 0x3F);
    } else if (code_point < 0x10000) {
      *target++ = 0xE0 | (code_point >> 12);
      if (target == target_end)
        break;
      *target++ = 0x80 | ((code_point >> 6) & 0x3F);
      if (target == target_end)
        break;
      *target++ = 0x80 | (code_point & 0x3F);
    } else {
      *target++ = 0xF0 | (code_point >> 18);
      if (target == target_end)
        break;
      *target++ = 0x80 | ((code_point >> 12) & 0x3F);
      if (target == target_end)
        break;
      *target++ = 0x80 | ((code_point >> 6) & 0x3F);
      if (target == target_end)
        break;
      *target++ = 0x80 | (code_point & 0x3F);
      /* uv__get_surrogate_value consumed 2 input characters */
      w_source_ptr++;
      if (w_source_len > 0)
        w_source_len--;
    }
    target_len = target - *target_ptr;
    w_source_ptr++;
    if (w_source_len > 0)
      w_source_len--;
  }

  if (target != target_end && target_len_ptr != NULL)
    /* Did not fill all of the provided buffer, so update the target_len_ptr
     * output with the space used. */
    *target_len_ptr = target - *target_ptr;

  /* Check if input fit into target exactly. */
  if (w_source_len < 0 && target == target_end && w_source_ptr[0] == 0)
    w_source_len = 0;

  *target++ = '\0';

  /* Characters remained after filling the buffer, compute the remaining length now. */
  if (w_source_len) {
    if (target_len_ptr != NULL)
      *target_len_ptr = target_len + uv_utf16_length_as_wtf8(w_source_ptr, w_source_len);
    return UV_ENOBUFS;
  }

  return 0;
}